

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_changemode(lua_State *L,int newmode)

{
  global_State *g_00;
  global_State *g;
  int newmode_local;
  lua_State *L_local;
  
  g_00 = L->l_G;
  if (g_00->gckind == '\x02') {
    g_00->gckind = '\0';
  }
  if (newmode != (uint)g_00->gckind) {
    if (newmode == 0) {
      minor2inc(L,g_00,'\0');
    }
    else {
      entergen(L,g_00);
    }
  }
  return;
}

Assistant:

void luaC_changemode (lua_State *L, int newmode) {
  global_State *g = G(L);
  if (g->gckind == KGC_GENMAJOR)  /* doing major collections? */
    g->gckind = KGC_INC;  /* already incremental but in name */
  if (newmode != g->gckind) {  /* does it need to change? */
    if (newmode == KGC_INC)  /* entering incremental mode? */
      minor2inc(L, g, KGC_INC);  /* entering incremental mode */
    else {
      lua_assert(newmode == KGC_GENMINOR);
      entergen(L, g);
    }
  }
}